

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O1

MPP_RET mpp_task_meta_get_buffer(MppTask task,MppMetaKey key,MppBuffer *buffer)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  
  MVar1 = check_mpp_task_name(task);
  MVar2 = MPP_NOK;
  if (MVar1 == MPP_OK) {
    MVar2 = mpp_meta_get_buffer(*(MppMeta *)((long)task + 0x28),key,buffer);
    if (MVar2 != MPP_OK) {
      *buffer = (MppBuffer)0x0;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_task_meta_get_buffer(MppTask task, MppMetaKey key, MppBuffer *buffer)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_buffer(impl->meta, key, buffer);
    if (ret)
        *buffer = NULL;
    return ret;
}